

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re.c
# Opt level: O2

int matchcharclass(char c,char *str)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  char cVar5;
  
  uVar1 = (uint)(c != '\v');
  uVar3 = (uint)(c == '\v');
  uVar4 = (uint)c;
  do {
    cVar5 = *str;
    if (c == '-') {
LAB_0010f8f8:
      if (cVar5 == '\\') {
        cVar5 = str[1];
        if (cVar5 == 'w') {
          uVar2 = matchalphanum(c);
LAB_0010fa14:
          if (uVar2 != 0) {
            return 1;
          }
        }
        else {
          if (cVar5 != 'S') {
            if (cVar5 == 'W') {
              uVar2 = matchalphanum(c);
              uVar2 = uVar2 ^ 1;
            }
            else {
              uVar2 = (uint)((byte)(c - 0x30U) < 10);
              if (cVar5 != 'd') {
                if (cVar5 == 's') {
                  uVar2 = uVar3;
                  if ((uVar4 < 0x21) && ((0x100003600U >> ((ulong)uVar4 & 0x3f) & 1) != 0)) {
                    return 1;
                  }
                }
                else {
                  uVar2 = (uint)((byte)(c - 0x3aU) < 0xf6);
                  if (cVar5 != 'D') {
                    uVar2 = (uint)(cVar5 == c);
                  }
                }
              }
            }
            goto LAB_0010fa14;
          }
          uVar2 = uVar1;
          if ((0x20 < uVar4) || ((0x100003600U >> ((ulong)uVar4 & 0x3f) & 1) == 0))
          goto LAB_0010fa14;
        }
        str = str + 1;
        if ((cVar5 == c) &&
           ((0x33 < uVar4 - 0x44 || ((0x8800100088001U >> ((ulong)(uVar4 - 0x44) & 0x3f) & 1) == 0))
           )) {
          return 1;
        }
      }
      else if (cVar5 == c) {
        if (c != '-') {
          return 1;
        }
        if (str[-1] != '\0') {
          return (uint)(str[1] == '\0');
        }
        return 1;
      }
    }
    else {
      if ((cVar5 != '\0') && (cVar5 != '-')) {
        if ((str[1] == '-') && (((c <= str[2] && (cVar5 <= c)) && (str[2] != '\0')))) {
          return 1;
        }
        goto LAB_0010f8f8;
      }
      if (cVar5 == c) {
        return 1;
      }
    }
    str = str + 1;
    if (cVar5 == '\0') {
      return 0;
    }
  } while( true );
}

Assistant:

static int matchcharclass(char c, const char* str)
{
  do
  {
    if (matchrange(c, str))
    {
      return 1;
    }
    else if (str[0] == '\\')
    {
      /* Escape-char: increment str-ptr and match on next char */
      str += 1;
      if (matchmetachar(c, str))
      {
        return 1;
      } 
      else if ((c == str[0]) && !ismetachar(c))
      {
        return 1;
      }
    }
    else if (c == str[0])
    {
      if (c == '-')
      {
        return ((str[-1] == '\0') || (str[1] == '\0'));
      }
      else
      {
        return 1;
      }
    }
  }
  while (*str++ != '\0');

  return 0;
}